

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O0

AttributeContainer * __thiscall
stackjit::AssemblyImageLoader::loadAttributes_abi_cxx11_
          (AttributeContainer *__return_storage_ptr__,AssemblyImageLoader *this,BinaryData *data,
          size_t *index)

{
  __node_base_ptr p_Var1;
  unsigned_long uVar2;
  unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_00;
  string *__args;
  _anonymous_namespace_ local_110 [8];
  string value;
  _anonymous_namespace_ local_f0 [8];
  string key;
  ulong local_d0;
  size_t j;
  size_t numValues;
  undefined1 local_a0 [8];
  Attribute attribute;
  size_t i;
  size_t numAttributes;
  size_t *index_local;
  BinaryData *data_local;
  AttributeContainer *attributes;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
  ::unordered_map(__return_storage_ptr__);
  p_Var1 = (__node_base_ptr)
           anon_unknown_5::loadData<unsigned_long>((BinaryData *)this,(size_t *)data);
  for (attribute.mValues._M_h._M_single_bucket = (__node_base_ptr)0x0;
      attribute.mValues._M_h._M_single_bucket < p_Var1;
      attribute.mValues._M_h._M_single_bucket =
           (__node_base_ptr)((long)&(attribute.mValues._M_h._M_single_bucket)->_M_nxt + 1)) {
    (anonymous_namespace)::loadString_abi_cxx11_
              ((_anonymous_namespace_ *)&numValues,(BinaryData *)this,(size_t *)data);
    Loader::Attribute::Attribute((Attribute *)local_a0,(string *)&numValues);
    std::__cxx11::string::~string((string *)&numValues);
    uVar2 = anon_unknown_5::loadData<unsigned_long>((BinaryData *)this,(size_t *)data);
    for (local_d0 = 0; local_d0 < uVar2; local_d0 = local_d0 + 1) {
      (anonymous_namespace)::loadString_abi_cxx11_(local_f0,(BinaryData *)this,(size_t *)data);
      (anonymous_namespace)::loadString_abi_cxx11_(local_110,(BinaryData *)this,(size_t *)data);
      this_00 = (unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 *)Loader::Attribute::values_abi_cxx11_((Attribute *)local_a0);
      std::
      unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<std::__cxx11::string&,std::__cxx11::string&>
                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)local_f0);
    }
    __args = Loader::Attribute::name_abi_cxx11_((Attribute *)local_a0);
    std::
    unordered_map<std::__cxx11::string,stackjit::Loader::Attribute,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>>>
    ::emplace<std::__cxx11::string_const&,stackjit::Loader::Attribute&>
              ((unordered_map<std::__cxx11::string,stackjit::Loader::Attribute,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Loader::Attribute>>>
                *)__return_storage_ptr__,__args,(Attribute *)local_a0);
    Loader::Attribute::~Attribute((Attribute *)local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

Loader::AttributeContainer AssemblyImageLoader::loadAttributes(BinaryData& data, std::size_t& index) {
		Loader::AttributeContainer attributes;
		std::size_t numAttributes = loadData<std::size_t>(data, index);
		for (std::size_t i = 0; i < numAttributes; i++) {
			Loader::Attribute attribute(loadString(data, index));

			std::size_t numValues = loadData<std::size_t>(data, index);
			for (std::size_t j = 0; j < numValues; j++) {
				std::string key = loadString(data, index);
				std::string value = loadString(data, index);
				attribute.values().emplace(key, value);
			}

			attributes.emplace(attribute.name(), attribute);
		}

		return attributes;
	}